

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StyleSheetSpecification.cpp
# Opt level: O0

bool Rml::StyleSheetSpecification::RegisterParser(String *parser_name,PropertyParser *parser)

{
  uint8_t *puVar1;
  bool bVar2;
  undefined8 uVar3;
  type ppPVar4;
  iterator local_40;
  undefined1 local_30 [8];
  iterator iterator;
  PropertyParser *parser_local;
  String *parser_name_local;
  
  iterator.mInfo = (uint8_t *)parser;
  _local_30 = robin_hood::detail::
              Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PropertyParser_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(instance,parser_name);
  local_40 = robin_hood::detail::
             Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PropertyParser_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(instance);
  bVar2 = robin_hood::detail::
          Table<true,80ul,std::__cxx11::string,Rml::PropertyParser*,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
          ::Iter<false>::operator!=((Iter<false> *)local_30,&local_40);
  puVar1 = iterator.mInfo;
  if (bVar2) {
    uVar3 = ::std::__cxx11::string::c_str();
    Log::Message(LT_WARNING,"Parser with name %s already exists!",uVar3);
  }
  else {
    ppPVar4 = robin_hood::detail::
              Table<true,80ul,std::__cxx11::string,Rml::PropertyParser*,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
              ::operator[]<Rml::PropertyParser*>
                        ((Table<true,80ul,std::__cxx11::string,Rml::PropertyParser*,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                          *)instance,parser_name);
    *ppPVar4 = (PropertyParser *)puVar1;
  }
  parser_name_local._7_1_ = !bVar2;
  return parser_name_local._7_1_;
}

Assistant:

bool StyleSheetSpecification::RegisterParser(const String& parser_name, PropertyParser* parser)
{
	ParserMap::iterator iterator = instance->parsers.find(parser_name);
	if (iterator != instance->parsers.end())
	{
		Log::Message(Log::LT_WARNING, "Parser with name %s already exists!", parser_name.c_str());
		return false;
	}

	instance->parsers[parser_name] = parser;
	return true;
}